

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_Matcher_x_iutest_x_StrCaseEq_Test::Body(iu_Matcher_x_iutest_x_StrCaseEq_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  string local_238;
  string local_218;
  AssertionResult local_1f8;
  iuCodeMessage local_1d0;
  undefined1 local_1a0 [392];
  
  local_1a0._0_8_ = &PTR__IMatcher_002258e8;
  local_1a0._8_8_ = "Hoge";
  iutest::detail::StrCaseEqMatcher<char[5]>::operator()
            (&local_1f8,(StrCaseEqMatcher<char[5]> *)local_1a0,(char (*) [5])0x1e84a2);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<char[5]>(&local_238,(char (*) [5])0x1e84a2);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_218,(detail *)local_238._M_dataplus._M_p,"StrCaseEq(\"Hoge\")",
               (char *)&local_1f8,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0xe9,local_218._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1a0._0_8_ = &PTR__IMatcher_00225928;
  local_1a0._8_8_ = (anonymous_namespace)::hoge_abi_cxx11_;
  iutest::detail::StrCaseEqMatcher<std::__cxx11::string>::operator()
            (&local_1f8,(StrCaseEqMatcher<std::__cxx11::string> *)local_1a0,(char (*) [5])0x1e84b2);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<char[5]>(&local_238,(char (*) [5])0x1e84b2);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_218,(detail *)local_238._M_dataplus._M_p,"StrCaseEq(hoge)",(char *)&local_1f8,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0xea,local_218._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1a0._0_8_ = &PTR__IMatcher_002258e8;
  local_1a0._8_8_ = "hOge";
  iutest::detail::StrCaseEqMatcher<char[5]>::operator()
            (&local_1f8,(StrCaseEqMatcher<char[5]> *)local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (anonymous_namespace)::hoge_abi_cxx11_);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<std::__cxx11::string>
              (&local_238,(iutest *)(anonymous_namespace)::hoge_abi_cxx11_,v);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_218,(detail *)local_238._M_dataplus._M_p,"StrCaseEq(\"hOge\")",
               (char *)&local_1f8,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0xeb,local_218._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1a0._0_8_ = &PTR__IMatcher_00225928;
  local_1a0._8_8_ = (anonymous_namespace)::Hoge_abi_cxx11_;
  iutest::detail::StrCaseEqMatcher<std::__cxx11::string>::operator()
            (&local_1f8,(StrCaseEqMatcher<std::__cxx11::string> *)local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (anonymous_namespace)::hoge_abi_cxx11_);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<std::__cxx11::string>
              (&local_238,(iutest *)(anonymous_namespace)::hoge_abi_cxx11_,v_00);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_218,(detail *)local_238._M_dataplus._M_p,"StrCaseEq(Hoge)",(char *)&local_1f8,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0xec,local_218._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  return;
}

Assistant:

IUTEST(Matcher, FloatNear)
{
    IUTEST_EXPECT_THAT(f0, FloatNear(0.0f, 0.0f));
    IUTEST_EXPECT_THAT(f0, FloatNear(1.0f, 1.0f));
    IUTEST_EXPECT_THAT(f0, FloatingPointNear(0.0f, 0.0f));
}